

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O3

Position * __thiscall
iDynTree::Axis::getPointOnAxisClosestToGivenPoint
          (Position *__return_storage_ptr__,Axis *this,Position *point)

{
  double dVar1;
  PointerType ptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  
  auVar2 = *(undefined1 (*) [16])(this->direction).super_Vector3.m_data;
  dVar5 = (this->direction).super_Vector3.m_data[2];
  auVar3._0_8_ = dVar5 * dVar5 + auVar2._8_8_ * auVar2._8_8_ + auVar2._0_8_ * auVar2._0_8_;
  if (0.0 < auVar3._0_8_) {
    auVar3._8_8_ = 0;
    auVar3 = sqrtpd(auVar3,auVar3);
    auVar4._0_8_ = auVar3._0_8_;
    dVar5 = dVar5 / auVar4._0_8_;
    auVar4._8_8_ = auVar4._0_8_;
    auVar2 = divpd(auVar2,auVar4);
  }
  dVar6 = ((point->super_Vector3).m_data[2] - (this->origin).super_Vector3.m_data[2]) * dVar5 +
          ((point->super_Vector3).m_data[1] - (this->origin).super_Vector3.m_data[1]) * auVar2._8_8_
          + ((point->super_Vector3).m_data[0] - (this->origin).super_Vector3.m_data[0]) *
            auVar2._0_8_;
  Position::Position(__return_storage_ptr__);
  dVar1 = (this->origin).super_Vector3.m_data[1];
  (__return_storage_ptr__->super_Vector3).m_data[0] =
       (this->origin).super_Vector3.m_data[0] + dVar6 * auVar2._0_8_;
  (__return_storage_ptr__->super_Vector3).m_data[1] = dVar1 + dVar6 * auVar2._8_8_;
  (__return_storage_ptr__->super_Vector3).m_data[2] =
       dVar5 * dVar6 + (this->origin).super_Vector3.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

iDynTree::Position Axis::getPointOnAxisClosestToGivenPoint(const iDynTree::Position& point) const
    {
            Eigen::Vector3d direction = iDynTree::toEigen(this->getDirection()).normalized();

            // Vector from the offset point of the to the given point
            Eigen::Vector3d axisOrigin_p_point = iDynTree::toEigen(point) - iDynTree::toEigen(this->getOrigin());

            // Project the axisOrigin_p_point onto the axis direction
            Eigen::Vector3d projection = direction * axisOrigin_p_point.dot(direction);

            // Calculate the closest point on the axis to the given point
            iDynTree::Position closestPointOnAxis;
            iDynTree::toEigen(closestPointOnAxis) = iDynTree::toEigen(this->getOrigin()) + projection;

            return closestPointOnAxis;
    }